

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder.c
# Opt level: O2

int ndn_forwarder_receive(ndn_face_intf_t *face,uint8_t *packet,size_t length)

{
  int iVar1;
  uint8_t *puVar2;
  ndn_pit_entry_t *entry;
  ndn_time_ms_t nVar3;
  ndn_table_id_t face_id;
  undefined1 auStack_68 [8];
  interest_options_t options;
  uint32_t val_len;
  uint32_t local_44;
  uint8_t *puStack_40;
  uint32_t type;
  uint8_t *name;
  size_t name_len;
  
  if (face == (ndn_face_intf_t *)0x0) {
    face_id = 0xffff;
  }
  else {
    face_id = face->face_id;
  }
  if (packet == (uint8_t *)0x0) {
    iVar1 = -0x10;
  }
  else {
    puVar2 = tlv_get_type_length(packet,length,&local_44,(uint32_t *)&options.hop_limit);
    if (packet + (length - (long)puVar2) == (uint8_t *)(ulong)(uint)options._12_4_) {
      if (local_44 == 6) {
        iVar1 = tlv_data_get_name(packet,length,&stack0xffffffffffffffc0,(size_t *)&name);
        if (iVar1 == 0) {
          iVar1 = fwd_data_pipeline(packet,length,puStack_40,(size_t)name,face_id);
        }
      }
      else if (local_44 == 5) {
        iVar1 = tlv_interest_get_header
                          (packet,length,(interest_options_t *)auStack_68,&stack0xffffffffffffffc0,
                           (size_t *)&name);
        if (iVar1 == 0) {
          entry = ndn_pit_find_or_insert(forwarder.pit,puStack_40,(size_t)name);
          if (entry == (ndn_pit_entry_t *)0x0) {
            iVar1 = -0x34;
          }
          else if ((uint32_t)options.lifetime == 0 ||
                   (entry->options).nonce != (uint32_t)options.lifetime) {
            if ((entry->on_data == (ndn_on_data_func)0x0) &&
               (entry->on_timeout == (ndn_on_timeout_func)0x0)) {
              (entry->options).lifetime = (uint64_t)auStack_68;
              (entry->options).nonce = (uint32_t)options.lifetime;
              (entry->options).hop_limit = (char)options.lifetime._4_4_;
              (entry->options).can_be_prefix = (_Bool)(char)((uint)options.lifetime._4_4_ >> 8);
              (entry->options).must_be_fresh = (_Bool)(char)((uint)options.lifetime._4_4_ >> 0x10);
              (entry->options).field_0xf = (char)((uint)options.lifetime._4_4_ >> 0x18);
            }
            nVar3 = ndn_time_now_ms();
            entry->last_time = nVar3;
            if (face_id != 0xffff) {
              entry->incoming_faces = entry->incoming_faces | 1L << ((byte)face_id & 0x3f);
            }
            iVar1 = fwd_on_outgoing_interest(packet,length,puStack_40,(size_t)name,entry,face_id);
          }
          else {
            printf("ERROR: %s, L%d: ","fwd_on_incoming_interest",0x161);
            puts("[FORWARDER] Drop by dead nonce");
            iVar1 = -0x37;
          }
        }
      }
      else {
        iVar1 = -0xc;
      }
    }
    else {
      iVar1 = -0xd;
    }
  }
  return iVar1;
}

Assistant:

int
ndn_forwarder_receive(ndn_face_intf_t* face, uint8_t* packet, size_t length)
{
  uint32_t type, val_len;
  uint8_t* buf;
  uint8_t *name;
  size_t name_len;
  interest_options_t options;
  int ret;
  ndn_table_id_t face_id = (face ? face->face_id : NDN_INVALID_ID);

  if (packet == NULL)
    return NDN_INVALID_POINTER;

  buf = tlv_get_type_length(packet, length, &type, &val_len);
  if (val_len != length - (buf - packet))
    return NDN_WRONG_TLV_LENGTH;

  if (type == TLV_Interest) {
    ret = tlv_interest_get_header(packet, length, &options, &name, &name_len);
    if (ret != NDN_SUCCESS)
      return ret;
    return fwd_on_incoming_interest(packet, length, &options, name, name_len, face_id);
  }
  else if(type == TLV_Data) {
    ret = tlv_data_get_name(packet, length, &name, &name_len);
    if (ret != NDN_SUCCESS)
      return ret;
    return fwd_data_pipeline(packet, length, name, name_len, face_id);
  }
  else {
    return NDN_WRONG_TLV_TYPE;
  }
}